

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VulkanHppGenerator.cpp
# Opt level: O0

string * anon_unknown.dwarf_b1723::generateNamespacedType
                   (string *__return_storage_ptr__,string *type)

{
  string *value;
  bool bVar1;
  allocator<char> local_59;
  string local_58;
  string local_38;
  string *local_18;
  string *type_local;
  
  local_18 = type;
  type_local = __return_storage_ptr__;
  bVar1 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
          starts_with(type,"Vk");
  value = local_18;
  if (bVar1) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_58,"Vk",&local_59);
    stripPrefix(&local_38,value,&local_58);
    std::operator+(__return_storage_ptr__,"VULKAN_HPP_NAMESPACE::",&local_38);
    std::__cxx11::string::~string((string *)&local_38);
    std::__cxx11::string::~string((string *)&local_58);
    std::allocator<char>::~allocator(&local_59);
  }
  else {
    std::__cxx11::string::string((string *)__return_storage_ptr__,local_18);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string generateNamespacedType( std::string const & type )
  {
    return type.starts_with( "Vk" ) ? ( "VULKAN_HPP_NAMESPACE::" + stripPrefix( type, "Vk" ) ) : type;
  }